

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O1

void __thiscall QEglFSCursor::update(QEglFSCursor *this,QRect *rect,bool allScreens)

{
  undefined8 uVar1;
  QEvent *this_00;
  
  if (this[0xe8] != (QEglFSCursor)0x0) {
    return;
  }
  this[0xe8] = (QEglFSCursor)0x1;
  this_00 = (QEvent *)operator_new(0x30);
  QEvent::QEvent(this_00,User|Timer);
  *(undefined ***)this_00 = &PTR__QEvent_00146568;
  *(undefined8 *)(this_00 + 0x10) = *(undefined8 *)(this + 0x60);
  uVar1 = *(undefined8 *)&rect->x2;
  *(undefined8 *)(this_00 + 0x18) = *(undefined8 *)rect;
  *(undefined8 *)(this_00 + 0x20) = uVar1;
  this_00[0x28] = (QEvent)allScreens;
  QCoreApplication::postEvent((QObject *)this,this_00,0);
  return;
}

Assistant:

void QEglFSCursor::update(const QRect &rect, bool allScreens)
{
    if (!m_updateRequested) {
        // Must not flush the window system events directly from here since we are likely to
        // be a called directly from QGuiApplication's processMouseEvents. Flushing events
        // could cause reentering by dispatching more queued mouse events.
        m_updateRequested = true;
        QCoreApplication::postEvent(this, new CursorUpdateEvent(m_cursor.pos, rect, allScreens));
    }
}